

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

StringRef * __thiscall llvm::StringRef::lower_abi_cxx11_(StringRef *this)

{
  ulong uVar1;
  size_type sVar2;
  char cVar3;
  char *pcVar4;
  long *in_RSI;
  size_type e;
  size_type i;
  StringRef *this_local;
  string *Result;
  
  i._7_1_ = 0;
  uVar1 = in_RSI[1];
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,uVar1,'\0',(allocator *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  e = 0;
  sVar2 = in_RSI[1];
  for (; e != sVar2; e = e + 1) {
    cVar3 = toLower(*(char *)(*in_RSI + e));
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
    *pcVar4 = cVar3;
  }
  return this;
}

Assistant:

std::string StringRef::lower() const {
  std::string Result(size(), char());
  for (size_type i = 0, e = size(); i != e; ++i) {
    Result[i] = toLower(Data[i]);
  }
  return Result;
}